

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.h
# Opt level: O2

uint32_t GET_32BIT_MSB_FIRST(void *vp)

{
  uint uVar1;
  
  uVar1 = *vp;
  return uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
}

Assistant:

static inline uint32_t GET_32BIT_MSB_FIRST(const void *vp)
{
    const uint8_t *p = (const uint8_t *)vp;
    return (((uint32_t)p[3]      ) | ((uint32_t)p[2] <<  8) |
            ((uint32_t)p[1] << 16) | ((uint32_t)p[0] << 24));
}